

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,TPZCompMesh *mesh,
          TPZCompElHDiv<pzshape::TPZShapeTriang> *copy)

{
  long in_RDX;
  TPZIntelGen<pzshape::TPZShapeTriang> *in_RDI;
  TPZCompMesh *in_stack_ffffffffffffffc0;
  TPZManVector<long,_4> *this_00;
  TPZManVector<int,_3> *in_stack_ffffffffffffffc8;
  TPZIntelGen<pzshape::TPZShapeTriang> *in_stack_ffffffffffffffd0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHDiv<pzshape::TPZShapeTriang>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024bbf10);
  TPZIntelGen<pzshape::TPZShapeTriang>::TPZIntelGen
            (in_stack_ffffffffffffffd0,(void **)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_RDI);
  *(undefined ***)
   &(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElHDiv_024bbaf0;
  *(undefined ***)
   &(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElHDiv_024bbaf0;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x19fd748);
  this_00 = (TPZManVector<long,_4> *)0xffffffffffffffff;
  TPZManVector<long,_4>::TPZManVector
            ((TPZManVector<long,_4> *)in_stack_ffffffffffffffd0,(int64_t)in_stack_ffffffffffffffc8,
             (long *)0xffffffffffffffff);
  *(undefined4 *)&in_RDI[2].fIntRule.fIntKsi = *(undefined4 *)(in_RDX + 0xd0);
  (in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.fPreferredOrder =
       *(int *)(in_RDX + 0x28);
  TPZManVector<long,_4>::operator=(this_00,(TPZManVector<long,_4> *)in_RDI);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh, const TPZCompElHDiv<TSHAPE> &copy) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy), fSideOrient(copy.fSideOrient), fhdivfam(copy.fhdivfam)
{
	this-> fPreferredOrder = copy.fPreferredOrder;
    this->fConnectIndexes = copy.fConnectIndexes;
}